

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.hpp
# Opt level: O0

void __thiscall
nlohmann::
basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
::numtostr::x_write<long>(numtostr *this,long x)

{
  reference pvVar1;
  size_type sVar2;
  iterator __first;
  iterator pvVar3;
  long lVar4;
  bool bVar5;
  long digit;
  size_t i;
  long lStack_20;
  bool is_negative;
  long x_local;
  numtostr *this_local;
  
  if (x == 0) {
    pvVar1 = std::array<char,_64UL>::operator[](&this->m_buf,0);
    *pvVar1 = '0';
  }
  else {
    digit = 0;
    lStack_20 = x;
    while( true ) {
      bVar5 = false;
      if (lStack_20 != 0) {
        sVar2 = std::array<char,_64UL>::size(&this->m_buf);
        bVar5 = (ulong)digit < sVar2 - 1;
      }
      if (!bVar5) break;
      lVar4 = lStack_20 % 10;
      if (lVar4 < 1) {
        lVar4 = -lVar4;
      }
      pvVar1 = std::array<char,_64UL>::operator[](&this->m_buf,digit);
      *pvVar1 = (char)lVar4 + '0';
      lStack_20 = lStack_20 / 10;
      digit = digit + 1;
    }
    if (lStack_20 != 0) {
      __assert_fail("x == 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antonio-ramadas[P]nurse-rostering-solution/code/json.hpp"
                    ,0x2066,
                    "void nlohmann::basic_json<>::numtostr::x_write(NumberType, std::true_type) [ObjectType = std::map, ArrayType = std::vector, StringType = std::basic_string<char>, BooleanType = bool, NumberIntegerType = long, NumberUnsignedType = unsigned long, NumberFloatType = double, AllocatorType = std::allocator, JSONSerializer = nlohmann::adl_serializer, NumberType = long]"
                   );
    }
    if (x < 0) {
      sVar2 = std::array<char,_64UL>::size(&this->m_buf);
      if (sVar2 - 2 <= (ulong)digit) {
        __assert_fail("i < m_buf.size() - 2",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antonio-ramadas[P]nurse-rostering-solution/code/json.hpp"
                      ,0x206b,
                      "void nlohmann::basic_json<>::numtostr::x_write(NumberType, std::true_type) [ObjectType = std::map, ArrayType = std::vector, StringType = std::basic_string<char>, BooleanType = bool, NumberIntegerType = long, NumberUnsignedType = unsigned long, NumberFloatType = double, AllocatorType = std::allocator, JSONSerializer = nlohmann::adl_serializer, NumberType = long]"
                     );
      }
      pvVar1 = std::array<char,_64UL>::operator[](&this->m_buf,digit);
      *pvVar1 = '-';
      digit = digit + 1;
    }
    __first = std::array<char,_64UL>::begin(&this->m_buf);
    pvVar3 = std::array<char,_64UL>::begin(&this->m_buf);
    std::reverse<char*>(__first,pvVar3 + digit);
  }
  return;
}

Assistant:

void x_write(NumberType x, /*is_integral=*/std::true_type)
        {
            // special case for "0"
            if (x == 0)
            {
                m_buf[0] = '0';
                return;
            }

            const bool is_negative = x < 0;
            size_t i = 0;

            // spare 1 byte for '\0'
            while (x != 0 and i < m_buf.size() - 1)
            {
                const auto digit = std::labs(static_cast<long>(x % 10));
                m_buf[i++] = static_cast<char>('0' + digit);
                x /= 10;
            }

            // make sure the number has been processed completely
            assert(x == 0);

            if (is_negative)
            {
                // make sure there is capacity for the '-'
                assert(i < m_buf.size() - 2);
                m_buf[i++] = '-';
            }

            std::reverse(m_buf.begin(), m_buf.begin() + i);
        }